

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Matchers::WithinRelMatcher::describe_abi_cxx11_(WithinRelMatcher *this)

{
  ReusableStringStream *this_00;
  ReusableStringStream *this_01;
  string *in_RDI;
  ReusableStringStream sstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  ReusableStringStream *in_stack_ffffffffffffff70;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff70);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff70,(char (*) [5])in_stack_ffffffffffffff68);
  Catch::Detail::stringify<double>((double *)in_stack_ffffffffffffff68);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = ReusableStringStream::operator<<
                      (in_stack_ffffffffffffff70,(char (*) [13])in_stack_ffffffffffffff68);
  this_01 = ReusableStringStream::operator<<(this_00,(double *)in_stack_ffffffffffffff68);
  ReusableStringStream::operator<<(this_00,(char (*) [16])this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  ReusableStringStream::str_abi_cxx11_(this_01);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

std::string WithinRelMatcher::describe() const {
        Catch::ReusableStringStream sstr;
        sstr << "and " << ::Catch::Detail::stringify(m_target) << " are within " << m_epsilon * 100. << "% of each other";
        return sstr.str();
    }